

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ElementSelectExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ElementSelectExpressionSyntax,slang::syntax::ExpressionSyntax&,slang::syntax::ElementSelectSyntax&>
          (BumpAllocator *this,ExpressionSyntax *args,ElementSelectSyntax *args_1)

{
  ElementSelectExpressionSyntax *pEVar1;
  
  pEVar1 = (ElementSelectExpressionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ElementSelectExpressionSyntax *)this->endPtr < pEVar1 + 1) {
    pEVar1 = (ElementSelectExpressionSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pEVar1 + 1);
  }
  (pEVar1->super_ExpressionSyntax).super_SyntaxNode.kind = ElementSelectExpression;
  (pEVar1->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pEVar1->super_ExpressionSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pEVar1->left).ptr = args;
  (pEVar1->select).ptr = args_1;
  (args->super_SyntaxNode).parent = (SyntaxNode *)pEVar1;
  (args_1->super_SyntaxNode).parent = (SyntaxNode *)pEVar1;
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }